

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O0

bool loadTransformBuffer(void)

{
  GLenum GVar1;
  float fovy;
  mat4 local_308;
  mat4 local_2c8;
  mat4 local_288;
  undefined1 local_248 [8];
  mat4 view;
  mat4 local_1c8;
  undefined1 local_188 [8];
  mat4 viewInv;
  mat4 projection;
  Transform transform;
  
  loadTransformBuffer::Transform::Transform((Transform *)&projection.m[3].z);
  if ((loadTransformBuffer::first & 1U) != 0) {
    g_gl.streams[0] = djgb_create(0x100);
    loadTransformBuffer::first = false;
  }
  fovy = radians(g_camera.fovy);
  dja::mat4::homogeneous::perspective
            ((mat4 *)&viewInv.m[3].z,fovy,(float)g_framebuffer.w / (float)g_framebuffer.h,
             g_camera.zNear,g_camera.zFar);
  dja::mat4::homogeneous::translation(&local_1c8,&g_camera.pos);
  dja::mat4::homogeneous::from_mat3((mat4 *)&view.m[3].z,&g_camera.axis);
  dja::operator*((mat4 *)local_188,&local_1c8,(mat4 *)&view.m[3].z);
  dja::inverse((mat4 *)local_248,(mat4 *)local_188);
  memcpy(&transform.modelView.m[3].z,&viewInv.m[3].z,0x40);
  dja::mat4::mat4(&local_2c8,1.0);
  dja::operator*(&local_288,(mat4 *)local_248,&local_2c8);
  memcpy(&projection.m[3].z,&local_288,0x40);
  dja::operator*(&local_308,(mat4 *)&transform.modelView.m[3].z,(mat4 *)&projection.m[3].z);
  memcpy(&transform.projection.m[3].z,&local_308,0x40);
  memcpy(&transform.modelViewProjection.m[3].z,local_188,0x40);
  djgb_to_gl(g_gl.streams[0],&projection.m[3].z,(int *)0x0);
  djgb_glbindrange(g_gl.streams[0],0x8a11,0);
  GVar1 = (*glad_glGetError)();
  return GVar1 == 0;
}

Assistant:

bool loadTransformBuffer()
{
    static bool first = true;
    struct Transform {
        dja::mat4 modelView, projection, modelViewProjection, viewInv;
    } transform;

    if (first) {
        g_gl.streams[STREAM_TRANSFORM] = djgb_create(sizeof(transform));
        first = false;
    }

    // extract view and projection matrices
    dja::mat4 projection = dja::mat4::homogeneous::perspective(
        radians(g_camera.fovy),
        (float)g_framebuffer.w / (float)g_framebuffer.h,
        g_camera.zNear,
        g_camera.zFar
    );
    dja::mat4 viewInv = dja::mat4::homogeneous::translation(g_camera.pos)
                  * dja::mat4::homogeneous::from_mat3(g_camera.axis);
    dja::mat4 view = dja::inverse(viewInv);


    // set transformations
    transform.projection = projection;
    transform.modelView  = view * dja::mat4(1);
    transform.modelViewProjection = transform.projection * transform.modelView;
    transform.viewInv = viewInv;

    // upload to GPU
    djgb_to_gl(g_gl.streams[STREAM_TRANSFORM], (const void *)&transform, NULL);
    djgb_glbindrange(g_gl.streams[STREAM_TRANSFORM],
                     GL_UNIFORM_BUFFER,
                     STREAM_TRANSFORM);

    return (glGetError() == GL_NO_ERROR);
}